

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_wo_reopen_test(void)

{
  fdb_encryption_key *pfVar1;
  short *psVar2;
  size_t *psVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint64_t extraout_RAX;
  uint64_t uVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar12;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar14;
  fdb_file_info *kvs_config_01;
  void *__s2;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  code *__s;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar18;
  char cVar19;
  uint uVar20;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar21;
  char *pcVar22;
  fdb_file_info *info_00;
  fdb_file_handle *pfVar23;
  fdb_iterator *pfVar24;
  btree *pbVar25;
  fdb_kvs_handle *pfVar26;
  undefined1 handle [8];
  btree *unaff_R12;
  fdb_kvs_handle *pfVar27;
  size_t unaff_R13;
  __atomic_base<unsigned_long> _Var28;
  filemgr *ptr_fhandle;
  fdb_config *pfVar29;
  ulong uVar30;
  btree *pbVar31;
  size_t sVar32;
  char *pcVar33;
  char *pcVar34;
  fdb_doc **ppfVar35;
  timeval tVar36;
  timeval tVar37;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_18b38;
  undefined1 auStack_18b30 [16];
  undefined1 auStack_18b20 [8];
  undefined1 auStack_18b18 [80];
  ulong uStack_18ac8;
  timeval tStack_18aa8;
  fdb_file_info afStack_18a98 [3];
  fdb_file_info afStack_18998 [3];
  fdb_config fStack_18898;
  filemgr *pfStack_187a0;
  fdb_kvs_handle *pfStack_18798;
  fdb_kvs_handle *pfStack_18790;
  fdb_config *pfStack_18788;
  fdb_kvs_handle *pfStack_18780;
  fdb_kvs_handle *pfStack_18778;
  fdb_file_handle *pfStack_18768;
  fdb_kvs_handle *pfStack_18760;
  timeval atStack_18758 [2];
  timeval tStack_18738;
  timeval tStack_18728;
  undefined1 auStack_18718 [70];
  undefined1 uStack_186d2;
  undefined8 uStack_186c8;
  filemgr *pfStack_18608;
  fdb_kvs_handle *pfStack_18600;
  fdb_kvs_handle *pfStack_185f8;
  filemgr *pfStack_185f0;
  fdb_kvs_handle *pfStack_185e8;
  fdb_kvs_handle *pfStack_185e0;
  undefined1 auStack_185d0 [8];
  undefined1 auStack_185c8 [8];
  undefined1 auStack_185c0 [8];
  undefined1 auStack_185b8 [16];
  undefined1 auStack_185a8 [16];
  fdb_kvs_config fStack_18598;
  atomic<unsigned_long> aStack_18580;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18578;
  __atomic_base<unsigned_long> _Stack_18570;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18568;
  undefined1 auStack_18560 [8];
  undefined1 auStack_18558 [16];
  undefined1 auStack_18548 [16];
  atomic<unsigned_long> aStack_18538;
  fdb_open_flags fStack_18524;
  ushort uStack_1851a;
  filemgr *pfStack_18510;
  atomic<unsigned_long> aStack_184d0;
  undefined1 auStack_18450 [16];
  timeval tStack_18440;
  undefined1 auStack_18430 [328];
  char acStack_182e8 [256];
  char acStack_181e8 [256];
  fdb_kvs_handle afStack_180e8 [153];
  fdb_kvs_handle *pfStack_4820;
  fdb_kvs_handle *pfStack_4818;
  list *plStack_4810;
  void *pvStack_4808;
  fdb_kvs_config fStack_4800;
  fdb_kvs_info fStack_47e8;
  timeval tStack_47b8;
  fdb_config fStack_47a8;
  char acStack_46b0 [256];
  fdb_kvs_handle afStack_45b0 [2];
  fdb_kvs_handle **ppfStack_4088;
  fdb_kvs_handle *pfStack_4080;
  fdb_kvs_handle *pfStack_4078;
  fdb_kvs_config *pfStack_4070;
  fdb_kvs_handle *pfStack_4068;
  fdb_kvs_handle *pfStack_4060;
  undefined1 auStack_4048 [16];
  undefined1 auStack_4038 [32];
  fdb_kvs_handle *pfStack_4018;
  fdb_kvs_config fStack_4010;
  fdb_kvs_info fStack_3ff8;
  timeval tStack_3fc8;
  char acStack_3fb8 [256];
  undefined1 auStack_3eb8 [752];
  char acStack_3bc8 [256];
  fdb_kvs_handle fStack_3ac8;
  fdb_doc **ppfStack_38c0;
  fdb_kvs_handle *pfStack_38b8;
  undefined1 auStack_38a0 [16];
  fdb_doc *pfStack_3890;
  fdb_kvs_handle *pfStack_3888;
  fdb_doc *apfStack_3880 [11];
  timeval tStack_3828;
  undefined1 auStack_3818 [536];
  char acStack_3600 [256];
  stat sStack_3500;
  fdb_config fStack_3470;
  fdb_kvs_handle **ppfStack_3378;
  fdb_kvs_handle *pfStack_3370;
  fdb_kvs_handle *pfStack_3368;
  fdb_kvs_handle *pfStack_3360;
  btree *pbStack_3358;
  fdb_kvs_handle *pfStack_3350;
  fdb_kvs_handle *pfStack_3340;
  fdb_kvs_handle *pfStack_3338;
  fdb_file_handle *pfStack_3330;
  fdb_kvs_handle *pfStack_3328;
  undefined1 auStack_3320 [32];
  undefined1 auStack_3300 [40];
  fdb_file_info fStack_32d8;
  fdb_config fStack_3290;
  btree abStack_3198 [4];
  char acStack_3098 [256];
  char acStack_2f98 [264];
  code *pcStack_2e90;
  fdb_kvs_handle *pfStack_2e88;
  fdb_kvs_handle *pfStack_2e80;
  char *pcStack_2e78;
  char *pcStack_2e70;
  fdb_kvs_handle *pfStack_2e68;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2e50;
  fdb_file_handle *pfStack_2e48;
  fdb_kvs_handle *pfStack_2e40;
  int iStack_2e34;
  undefined1 auStack_2e30 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2df0;
  fdb_kvs_config fStack_2dc8;
  timeval tStack_2db0;
  char acStack_2da0 [256];
  fdb_doc *apfStack_2ca0 [20];
  undefined1 auStack_2c00 [520];
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined4 uStack_29dc;
  undefined1 uStack_29d1;
  undefined1 uStack_29c0;
  undefined8 uStack_2948;
  size_t sStack_2908;
  size_t sStack_2900;
  fdb_doc **ppfStack_28f8;
  char *pcStack_28f0;
  code *pcStack_28e8;
  code *pcStack_28e0;
  fdb_file_handle *pfStack_28c8;
  fdb_snapshot_info_t *pfStack_28c0;
  uint64_t uStack_28b8;
  uint uStack_28ac;
  fdb_kvs_handle *apfStack_28a8 [4];
  fdb_kvs_config fStack_2888;
  char acStack_2870 [8];
  timeval tStack_2868;
  char acStack_2858 [256];
  char acStack_2758 [256];
  char acStack_2658 [264];
  fdb_config fStack_2550;
  fdb_doc *apfStack_2458 [301];
  fdb_kvs_handle **ppfStack_1af0;
  btree *pbStack_1ae8;
  size_t sStack_1ae0;
  fdb_kvs_handle *pfStack_1ad8;
  btree *pbStack_1ad0;
  fdb_kvs_handle *pfStack_1ac8;
  fdb_kvs_handle *pfStack_1ab0;
  fdb_iterator *pfStack_1aa8;
  fdb_kvs_handle *pfStack_1aa0;
  undefined1 auStack_1a98 [16];
  undefined1 auStack_1a88 [40];
  btree bStack_1a60;
  fdb_kvs_info fStack_1a18;
  fdb_config fStack_19e8;
  char acStack_18f0 [256];
  fdb_kvs_handle fStack_17f0;
  fdb_kvs_handle **ppfStack_15e8;
  btree *pbStack_15e0;
  size_t sStack_15d8;
  fdb_kvs_config *pfStack_15d0;
  fdb_file_handle **ppfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  fdb_kvs_handle *pfStack_15b0;
  fdb_file_handle *pfStack_15a8;
  fdb_kvs_config fStack_15a0;
  timeval tStack_1588;
  fdb_kvs_info fStack_1578;
  char acStack_1548 [264];
  fdb_config fStack_1440;
  char acStack_1348 [256];
  char acStack_1248 [256];
  fdb_doc *apfStack_1148 [101];
  fdb_kvs_handle **ppfStack_e20;
  btree *pbStack_e18;
  size_t sStack_e10;
  fdb_kvs_handle *pfStack_e08;
  btree *pbStack_e00;
  fdb_kvs_handle *pfStack_df8;
  undefined1 auStack_de0 [16];
  fdb_kvs_handle *pfStack_dd0;
  fdb_kvs_handle *pfStack_dc8;
  btree_kv_ops *pbStack_dc0;
  undefined1 auStack_db8 [40];
  docio_handle *pdStack_d90;
  timeval tStack_d58;
  fdb_config fStack_d48;
  btree abStack_c50 [4];
  btree abStack_b50 [14];
  fdb_kvs_handle fStack_830;
  fdb_kvs_handle **ppfStack_528;
  btree *pbStack_520;
  size_t sStack_518;
  fdb_kvs_handle *pfStack_510;
  btree *pbStack_508;
  fdb_kvs_handle *pfStack_500;
  fdb_kvs_handle *local_4f0;
  fdb_kvs_handle *local_4e8;
  fdb_doc *local_4e0;
  fdb_kvs_handle *local_4d8;
  fdb_file_handle *local_4d0;
  undefined1 auStack_4c8 [32];
  undefined1 local_4a8 [40];
  fdb_file_info local_480;
  char local_438 [264];
  fdb_config local_330;
  fdb_kvs_handle local_238;
  
  pfStack_500 = (fdb_kvs_handle *)0x10ca23;
  gettimeofday((timeval *)(local_4a8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_500 = (fdb_kvs_handle *)0x10ca28;
  memleak_start();
  pfStack_500 = (fdb_kvs_handle *)0x10ca34;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_500 = (fdb_kvs_handle *)0x10ca44;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)local_4a8;
  pfStack_500 = (fdb_kvs_handle *)0x10ca51;
  fdb_get_default_kvs_config();
  local_330.buffercache_size = 0x1000000;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_threshold = '\0';
  pbVar31 = (btree *)&local_4e0;
  pfStack_500 = (fdb_kvs_handle *)0x10ca83;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&local_330);
  ppfVar18 = &local_4e8;
  pfStack_500 = (fdb_kvs_handle *)0x10ca96;
  fdb_kvs_open_default((fdb_file_handle *)local_4e0,ppfVar18,(fdb_kvs_config *)pfVar7);
  pfStack_500 = (fdb_kvs_handle *)0x10caac;
  fVar4 = fdb_set_log_callback(local_4e8,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_500 = (fdb_kvs_handle *)0x10cad0;
    fdb_open(&local_4d0,"./compact_test1",&local_330);
    ppfVar18 = &local_4d8;
    pfStack_500 = (fdb_kvs_handle *)0x10cae5;
    fdb_kvs_open_default(local_4d0,ppfVar18,(fdb_kvs_config *)local_4a8);
    pfStack_500 = (fdb_kvs_handle *)0x10cafb;
    fVar4 = fdb_set_log_callback(local_4d8,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      unaff_R12 = (btree *)0x0;
      uVar15 = 0;
      do {
        pfVar1 = &local_238.config.encryption_key;
        pfStack_500 = (fdb_kvs_handle *)0x10cb23;
        sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
        pfStack_500 = (fdb_kvs_handle *)0x10cb3b;
        sprintf((char *)&local_238,"meta%d",uVar15 & 0xffffffff);
        pfStack_500 = (fdb_kvs_handle *)0x10cb53;
        sprintf(local_438,"body%d",uVar15 & 0xffffffff);
        pbVar31 = (btree *)(auStack_4c8 + (long)unaff_R12);
        pfStack_500 = (fdb_kvs_handle *)0x10cb63;
        sVar6 = strlen((char *)pfVar1);
        unaff_RBP = &local_238;
        pfStack_500 = (fdb_kvs_handle *)0x10cb76;
        pfVar7 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
        pfStack_500 = (fdb_kvs_handle *)0x10cb86;
        sVar8 = strlen(local_438);
        pfStack_500 = (fdb_kvs_handle *)0x10cbab;
        fdb_doc_create((fdb_doc **)pbVar31,&local_238.config.encryption_key,sVar6,unaff_RBP,
                       (size_t)pfVar7,local_438,sVar8);
        pfStack_500 = (fdb_kvs_handle *)0x10cbba;
        fdb_set(local_4e8,*(fdb_doc **)(auStack_4c8 + uVar15 * 8));
        uVar15 = uVar15 + 1;
        unaff_R12 = (btree *)((long)unaff_R12 + 8);
      } while (uVar15 != 3);
      unaff_R13 = 0;
      ppfVar18 = &local_4f0;
      pfStack_500 = (fdb_kvs_handle *)0x10cbfa;
      fdb_doc_create((fdb_doc **)ppfVar18,*(void **)(auStack_4c8._8_8_ + 0x20),
                     *(size_t *)auStack_4c8._8_8_,*(void **)(auStack_4c8._8_8_ + 0x38),
                     *(size_t *)(auStack_4c8._8_8_ + 8),(void *)0x0,0);
      *(bool *)&local_4f0->file = true;
      pfStack_500 = (fdb_kvs_handle *)0x10cc0b;
      fdb_set(local_4e8,(fdb_doc *)local_4f0);
      pfStack_500 = (fdb_kvs_handle *)0x10cc13;
      fdb_doc_free((fdb_doc *)local_4f0);
      pfStack_500 = (fdb_kvs_handle *)0x10cc22;
      fdb_commit((fdb_file_handle *)local_4e0,'\x01');
      pfStack_500 = (fdb_kvs_handle *)0x10cc33;
      fdb_compact((fdb_file_handle *)local_4e0,"./compact_test2");
      while( true ) {
        pfStack_500 = (fdb_kvs_handle *)0x10cc57;
        fdb_doc_create((fdb_doc **)ppfVar18,(void *)(*(size_t **)(auStack_4c8 + unaff_R13 * 8))[4],
                       **(size_t **)(auStack_4c8 + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_500 = (fdb_kvs_handle *)0x10cc66;
        fVar4 = fdb_get(local_4d8,(fdb_doc *)local_4f0);
        pfVar27 = local_4f0;
        if (unaff_R13 != 1) break;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cdb5;
LAB_0010cccc:
        pfStack_500 = (fdb_kvs_handle *)0x10ccd4;
        fdb_doc_free((fdb_doc *)pfVar27);
        unaff_R13 = unaff_R13 + 1;
        pfVar7 = pfVar27;
        if (unaff_R13 == 3) {
          pfStack_500 = (fdb_kvs_handle *)0x10ccf3;
          fdb_get_file_info(local_4d0,&local_480);
          pfStack_500 = (fdb_kvs_handle *)0x10cd02;
          iVar5 = strcmp("./compact_test2",local_480.filename);
          if (iVar5 != 0) {
            pfStack_500 = (fdb_kvs_handle *)0x10cd10;
            compact_wo_reopen_test();
          }
          lVar16 = 0;
          do {
            pfStack_500 = (fdb_kvs_handle *)0x10cd1c;
            fdb_doc_free(*(fdb_doc **)(auStack_4c8 + lVar16 * 8));
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          pfStack_500 = (fdb_kvs_handle *)0x10cd2f;
          fdb_kvs_close(local_4e8);
          pfStack_500 = (fdb_kvs_handle *)0x10cd39;
          fdb_kvs_close(local_4d8);
          pfStack_500 = (fdb_kvs_handle *)0x10cd43;
          fdb_close((fdb_file_handle *)local_4e0);
          pfStack_500 = (fdb_kvs_handle *)0x10cd4d;
          fdb_close(local_4d0);
          pfStack_500 = (fdb_kvs_handle *)0x10cd52;
          fdb_shutdown();
          pfStack_500 = (fdb_kvs_handle *)0x10cd57;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_500 = (fdb_kvs_handle *)0x10cd88;
          fprintf(_stderr,pcVar22,"compaction without reopen test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar31 = local_4f0->staletree;
        unaff_RBP = *(fdb_kvs_handle **)(auStack_4c8 + unaff_R13 * 8);
        unaff_R12 = unaff_RBP->staletree;
        pfStack_500 = (fdb_kvs_handle *)0x10cca5;
        iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(local_4f0->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar31 = (pfVar27->field_6).seqtree;
          unaff_R12 = (unaff_RBP->field_6).seqtree;
          pfStack_500 = (fdb_kvs_handle *)0x10ccc4;
          iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar27->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010cccc;
          pfStack_500 = (fdb_kvs_handle *)0x10cda5;
          compact_wo_reopen_test();
          pfVar7 = pfVar27;
          goto LAB_0010cda5;
        }
      }
      else {
LAB_0010cda5:
        pfVar27 = pfVar7;
        pfStack_500 = (fdb_kvs_handle *)0x10cdaa;
        compact_wo_reopen_test();
      }
      pfStack_500 = (fdb_kvs_handle *)0x10cdb5;
      compact_wo_reopen_test();
      pfVar7 = pfVar27;
LAB_0010cdb5:
      pfStack_500 = (fdb_kvs_handle *)0x10cdba;
      compact_wo_reopen_test();
      goto LAB_0010cdba;
    }
  }
  else {
LAB_0010cdba:
    pfStack_500 = (fdb_kvs_handle *)0x10cdbf;
    compact_wo_reopen_test();
  }
  pfStack_500 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_df8 = (fdb_kvs_handle *)0x10cde4;
  ppfStack_528 = ppfVar18;
  pbStack_520 = unaff_R12;
  sStack_518 = unaff_R13;
  pfStack_510 = pfVar7;
  pbStack_508 = pbVar31;
  pfStack_500 = unaff_RBP;
  gettimeofday(&tStack_d58,(__timezone_ptr_t)0x0);
  pfStack_df8 = (fdb_kvs_handle *)0x10cde9;
  memleak_start();
  pfStack_df8 = (fdb_kvs_handle *)0x10cdf5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10ce05;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_db8;
  pfStack_df8 = (fdb_kvs_handle *)0x10ce12;
  fdb_get_default_kvs_config();
  fStack_d48.buffercache_size = 0x1000000;
  fStack_d48.wal_threshold = 0x400;
  fStack_d48.flags = 1;
  fStack_d48.compaction_threshold = '\0';
  pbVar31 = (btree *)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10ce44;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_d48);
  ppfVar18 = (fdb_kvs_handle **)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10ce57;
  fdb_kvs_open_default((fdb_file_handle *)auStack_de0._0_8_,ppfVar18,(fdb_kvs_config *)pfVar7);
  pfStack_df8 = (fdb_kvs_handle *)0x10ce6d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d61b;
  unaff_R12 = (btree *)0x0;
  uVar15 = 0;
  do {
    pfVar1 = &fStack_830.config.encryption_key;
    pfStack_df8 = (fdb_kvs_handle *)0x10ce95;
    sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10cead;
    sprintf((char *)&fStack_830,"meta%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10cec5;
    sprintf((char *)abStack_c50,"body%d",uVar15 & 0xffffffff);
    pbVar31 = (btree *)(&abStack_b50[0].ksize + (long)unaff_R12);
    pfStack_df8 = (fdb_kvs_handle *)0x10ced8;
    unaff_R13 = strlen((char *)pfVar1);
    unaff_RBP = &fStack_830;
    pfStack_df8 = (fdb_kvs_handle *)0x10ceeb;
    sVar6 = strlen((char *)unaff_RBP);
    pfStack_df8 = (fdb_kvs_handle *)0x10cefb;
    sVar8 = strlen((char *)abStack_c50);
    pfStack_df8 = (fdb_kvs_handle *)0x10cf20;
    fdb_doc_create((fdb_doc **)pbVar31,&fStack_830.config.encryption_key,unaff_R13,unaff_RBP,sVar6,
                   abStack_c50,sVar8);
    pfStack_df8 = (fdb_kvs_handle *)0x10cf32;
    fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,*(fdb_doc **)(&abStack_b50[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    unaff_R12 = (btree *)((long)unaff_R12 + 8);
  } while (uVar15 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf72;
  fdb_doc_create((fdb_doc **)&pfStack_dd0,*(void **)(abStack_b50[0].root_bid + 0x20),
                 *(size_t *)abStack_b50[0].root_bid,*(void **)(abStack_b50[0].root_bid + 0x38),
                 *(size_t *)(abStack_b50[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_dd0->file = 1;
  ppfVar18 = (fdb_kvs_handle **)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf86;
  fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf8e;
  fdb_doc_free((fdb_doc *)pfStack_dd0);
  pfVar7 = (fdb_kvs_handle *)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10cfa0;
  fdb_commit((fdb_file_handle *)auStack_de0._0_8_,'\x01');
  pfStack_df8 = (fdb_kvs_handle *)0x10cfaf;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,"./compact_test2");
  pfStack_df8 = (fdb_kvs_handle *)0x10cfb7;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10cfbf;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10cfcb;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10cfe2;
  fdb_open((fdb_file_handle **)pfVar7,"./compact_test1",&fStack_d48);
  pfStack_df8 = (fdb_kvs_handle *)0x10cff2;
  fdb_kvs_open_default((fdb_file_handle *)auStack_de0._0_8_,ppfVar18,(fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d008;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d620;
  unaff_R13 = 0;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d03f;
    fdb_doc_create((fdb_doc **)&pfStack_dd0,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_df8 = (fdb_kvs_handle *)0x10d04e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
    pfVar27 = pfStack_dd0;
    if (unaff_R13 == 1) {
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d616;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d606;
      pbVar31 = pfStack_dd0->staletree;
      unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + unaff_R13 * 8);
      unaff_R12 = unaff_RBP->staletree;
      pfStack_df8 = (fdb_kvs_handle *)0x10d090;
      iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d60b;
      pbVar31 = (pfVar27->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_df8 = (fdb_kvs_handle *)0x10d0af;
      iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar27->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5fb;
    }
    pfStack_df8 = (fdb_kvs_handle *)0x10d0bf;
    fdb_doc_free((fdb_doc *)pfVar27);
    unaff_R13 = unaff_R13 + 1;
    pfVar7 = pfVar27;
  } while (unaff_R13 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10d0de;
  fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
  pfStack_df8 = (fdb_kvs_handle *)0x10d0ed;
  iVar5 = strcmp("./compact_test1",(char *)auStack_db8._24_8_);
  if (iVar5 != 0) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d0fb;
    compact_with_reopen_test();
  }
  pfVar7 = &fStack_830;
  unaff_R12 = abStack_c50;
  unaff_R13 = 0;
  uVar15 = 0;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d123;
    sprintf((char *)pfVar7,"newmeta%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10d13e;
    sprintf((char *)unaff_R12,"newbody%d_%s",uVar15 & 0xffffffff,&fStack_830.bub_ctx.handle);
    pfStack_df8 = (fdb_kvs_handle *)0x10d151;
    pbVar31 = (btree *)strlen((char *)pfVar7);
    pfStack_df8 = (fdb_kvs_handle *)0x10d15c;
    sVar6 = strlen((char *)unaff_R12);
    pfStack_df8 = (fdb_kvs_handle *)0x10d170;
    fdb_doc_update((fdb_doc **)(&abStack_b50[0].ksize + unaff_R13),pfVar7,(size_t)pbVar31,unaff_R12,
                   sVar6);
    pfStack_df8 = (fdb_kvs_handle *)0x10d182;
    fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,*(fdb_doc **)(&abStack_b50[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    unaff_R13 = unaff_R13 + 8;
  } while (uVar15 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10d1ab;
  fdb_open((fdb_file_handle **)&pbStack_dc0,"./compact_test1",&fStack_d48);
  ppfVar18 = &pfStack_dc8;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1c0;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_dc0,ppfVar18,(fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d1d6;
  fVar4 = fdb_set_log_callback(pfStack_dc8,logCallbackFunc,"compact_with_reopen_test");
  unaff_RBP = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d625;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1ea;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62a;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1fe;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62f;
  pfStack_df8 = (fdb_kvs_handle *)0x10d212;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d634;
  pfStack_df8 = (fdb_kvs_handle *)0x10d224;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d22e;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  unaff_R13 = 0;
  ppfVar18 = &pfStack_dd0;
  pfVar13 = pfVar7;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d25d;
    fdb_doc_create((fdb_doc **)ppfVar18,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_df8 = (fdb_kvs_handle *)0x10d26c;
    fVar4 = fdb_get(pfStack_dc8,(fdb_doc *)pfStack_dd0);
    pfVar7 = pfStack_dd0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d5ca;
      compact_with_reopen_test();
LAB_0010d5ca:
      pfStack_df8 = (fdb_kvs_handle *)0x10d5d5;
      compact_with_reopen_test();
LAB_0010d5d5:
      pfStack_df8 = (fdb_kvs_handle *)0x10d5e0;
      compact_with_reopen_test();
      goto LAB_0010d5e0;
    }
    pbVar31 = pfStack_dd0->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + unaff_R13 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d298;
    iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
    pfVar13 = pfVar7;
    if (iVar5 != 0) goto LAB_0010d5ca;
    pbVar31 = (pfVar7->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d2b7;
    iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5d5;
    pfStack_df8 = (fdb_kvs_handle *)0x10d2c7;
    fdb_doc_free((fdb_doc *)pfVar7);
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R13 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10d2ed;
  fVar4 = fdb_open((fdb_file_handle **)auStack_de0,"./compact_test1",&fStack_d48);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d639;
  pfStack_df8 = (fdb_kvs_handle *)0x10d309;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)(auStack_de0 + 8),
                     (fdb_kvs_config *)auStack_db8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d63e;
  pfStack_df8 = (fdb_kvs_handle *)0x10d329;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d643;
  pfStack_df8 = (fdb_kvs_handle *)0x10d343;
  fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
  pfStack_df8 = (fdb_kvs_handle *)0x10d352;
  iVar5 = strcmp("./compact_test1.3",(char *)auStack_db8._24_8_);
  if (iVar5 != 0) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d360;
    compact_with_reopen_test();
  }
  pfStack_df8 = (fdb_kvs_handle *)0x10d36a;
  fdb_kvs_close(pfStack_dc8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d374;
  fdb_close((fdb_file_handle *)pbStack_dc0);
  unaff_R13 = 0;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d3a3;
    fdb_doc_create((fdb_doc **)&pfStack_dd0,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_df8 = (fdb_kvs_handle *)0x10d3b2;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
    pfVar27 = pfStack_dd0;
    pfVar13 = pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e0;
    pbVar31 = pfStack_dd0->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + unaff_R13 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d3de;
    iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5e5;
    pbVar31 = (pfVar27->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d3fd;
    iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar27->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5f0;
    pfStack_df8 = (fdb_kvs_handle *)0x10d40d;
    fdb_doc_free((fdb_doc *)pfVar27);
    unaff_R13 = unaff_R13 + 1;
    pfVar7 = pfVar27;
  } while (unaff_R13 != 100);
  ppfVar18 = (fdb_kvs_handle **)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d429;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  pfVar7 = (fdb_kvs_handle *)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d436;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d43e;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d44a;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10d461;
  fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_d48);
  pfStack_df8 = (fdb_kvs_handle *)0x10d471;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)pfVar7,
             (fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d487;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d648;
  ppfVar18 = (fdb_kvs_handle **)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d49e;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  pfStack_df8 = (fdb_kvs_handle *)0x10d4a8;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d4b0;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d4c7;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_d48);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d64d;
  pfStack_df8 = (fdb_kvs_handle *)0x10d4e3;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)(auStack_de0 + 8),
                     (fdb_kvs_config *)auStack_db8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d652;
  pfStack_df8 = (fdb_kvs_handle *)0x10d503;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d51d;
    fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
    pfStack_df8 = (fdb_kvs_handle *)0x10d52c;
    iVar5 = strcmp("./compact_test.fdb",(char *)auStack_db8._24_8_);
    if (iVar5 != 0) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d53a;
      compact_with_reopen_test();
    }
    if (pdStack_d90 != (docio_handle *)0x64) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d54c;
      compact_with_reopen_test();
    }
    lVar16 = 0;
    do {
      pfStack_df8 = (fdb_kvs_handle *)0x10d55b;
      fdb_doc_free(*(fdb_doc **)(&abStack_b50[0].ksize + lVar16 * 8));
      lVar16 = lVar16 + 1;
    } while (lVar16 != 100);
    pfStack_df8 = (fdb_kvs_handle *)0x10d56e;
    fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
    pfStack_df8 = (fdb_kvs_handle *)0x10d578;
    fdb_close((fdb_file_handle *)auStack_de0._0_8_);
    pfStack_df8 = (fdb_kvs_handle *)0x10d57d;
    fdb_shutdown();
    pfStack_df8 = (fdb_kvs_handle *)0x10d582;
    memleak_end();
    pcVar22 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar22 = "%s FAILED\n";
    }
    pfStack_df8 = (fdb_kvs_handle *)0x10d5b3;
    fprintf(_stderr,pcVar22,"compaction with reopen test");
    return;
  }
  goto LAB_0010d657;
LAB_0010eb2a:
  pfStack_2e68 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar34 = pcVar33;
  goto LAB_0010eb2f;
LAB_001108a3:
  pfStack_185e0 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var28._M_i;
LAB_001108ae:
  _Var28._M_i = doc._M_i;
  pfStack_185e0 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_185e0 = (fdb_kvs_handle *)0x1108be;
  pcVar33 = pcVar22;
  compaction_daemon_test();
  doc._M_i = _Var28._M_i;
LAB_001108be:
  pfVar13 = (fdb_kvs_handle *)auStack_185b8;
  ptr_fhandle = (filemgr *)(auStack_18430 + 0x48);
  pfStack_185e0 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_0010d5e0:
  pfVar27 = pfVar13;
  pfStack_df8 = (fdb_kvs_handle *)0x10d5e5;
  compact_with_reopen_test();
LAB_0010d5e5:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5fb;
  compact_with_reopen_test();
LAB_0010d5fb:
  pfStack_df8 = (fdb_kvs_handle *)0x10d606;
  compact_with_reopen_test();
  pfVar7 = pfVar27;
LAB_0010d606:
  pfVar27 = pfVar7;
  pfStack_df8 = (fdb_kvs_handle *)0x10d60b;
  compact_with_reopen_test();
LAB_0010d60b:
  pfStack_df8 = (fdb_kvs_handle *)0x10d616;
  compact_with_reopen_test();
  pfVar7 = pfVar27;
LAB_0010d616:
  ppfVar18 = &pfStack_dd0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d61b;
  compact_with_reopen_test();
LAB_0010d61b:
  pfStack_df8 = (fdb_kvs_handle *)0x10d620;
  compact_with_reopen_test();
LAB_0010d620:
  pfStack_df8 = (fdb_kvs_handle *)0x10d625;
  compact_with_reopen_test();
LAB_0010d625:
  pfStack_df8 = (fdb_kvs_handle *)0x10d62a;
  compact_with_reopen_test();
LAB_0010d62a:
  pfStack_df8 = (fdb_kvs_handle *)0x10d62f;
  compact_with_reopen_test();
LAB_0010d62f:
  pfStack_df8 = (fdb_kvs_handle *)0x10d634;
  compact_with_reopen_test();
LAB_0010d634:
  pfStack_df8 = (fdb_kvs_handle *)0x10d639;
  compact_with_reopen_test();
LAB_0010d639:
  pfStack_df8 = (fdb_kvs_handle *)0x10d63e;
  compact_with_reopen_test();
LAB_0010d63e:
  pfStack_df8 = (fdb_kvs_handle *)0x10d643;
  compact_with_reopen_test();
LAB_0010d643:
  pfStack_df8 = (fdb_kvs_handle *)0x10d648;
  compact_with_reopen_test();
LAB_0010d648:
  pfStack_df8 = (fdb_kvs_handle *)0x10d64d;
  compact_with_reopen_test();
LAB_0010d64d:
  pfStack_df8 = (fdb_kvs_handle *)0x10d652;
  compact_with_reopen_test();
LAB_0010d652:
  pfStack_df8 = (fdb_kvs_handle *)0x10d657;
  compact_with_reopen_test();
LAB_0010d657:
  pfStack_df8 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d679;
  ppfStack_e20 = ppfVar18;
  pbStack_e18 = unaff_R12;
  sStack_e10 = unaff_R13;
  pfStack_e08 = pfVar7;
  pbStack_e00 = pbVar31;
  pfStack_df8 = unaff_RBP;
  gettimeofday(&tStack_1588,(__timezone_ptr_t)0x0);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d67e;
  memleak_start();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d68a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15c0 = (fdb_kvs_handle *)0x10d69a;
  fdb_get_default_config();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d6a7;
  fdb_get_default_kvs_config();
  fStack_1440.wal_threshold = 0x400;
  fStack_1440.flags = 1;
  fStack_1440.compaction_threshold = '\0';
  pfStack_15c0 = (fdb_kvs_handle *)0x10d6d1;
  fdb_open(&pfStack_15a8,"./compact_test1",&fStack_1440);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d6eb;
  fdb_kvs_open(pfStack_15a8,&pfStack_15b0,"db",&fStack_15a0);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d701;
  fVar4 = fdb_set_log_callback(pfStack_15b0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d729;
      sprintf(acStack_1248,"key%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d741;
      sprintf(acStack_1348,"meta%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d756;
      sprintf(acStack_1548,"body%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d769;
      sVar6 = strlen(acStack_1248);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d77c;
      sVar8 = strlen(acStack_1348);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d789;
      sVar9 = strlen(acStack_1548);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d7ab;
      fdb_doc_create((fdb_doc **)((long)apfStack_1148 + lVar16),acStack_1248,sVar6,acStack_1348,
                     sVar8,acStack_1548,sVar9);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d7bd;
      fdb_set(pfStack_15b0,apfStack_1148[uVar15]);
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar15 != 100);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7dd;
    fdb_commit(pfStack_15a8,'\0');
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7e7;
    fdb_compact(pfStack_15a8,(char *)0x0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7fd;
    fdb_get_kvs_info(pfStack_15b0,&fStack_1578);
    lVar16 = (long)(int)fStack_1578.doc_count;
    pfStack_15c0 = (fdb_kvs_handle *)0x10d80a;
    fdb_kvs_close(pfStack_15b0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d812;
    fdb_close(pfStack_15a8);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d829;
    fdb_open(&pfStack_15a8,"./compact_test1",&fStack_1440);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d840;
    fdb_kvs_open(pfStack_15a8,&pfStack_15b0,"db",&fStack_15a0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d84c;
    fdb_get_kvs_info(pfStack_15b0,&fStack_1578);
    if (lVar16 != CONCAT44(fStack_1578.doc_count._4_4_,(int)fStack_1578.doc_count)) {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d85f;
      compact_reopen_named_kvs();
    }
    pfStack_15c0 = (fdb_kvs_handle *)0x10d869;
    fdb_kvs_close(pfStack_15b0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d873;
    fdb_close(pfStack_15a8);
    lVar16 = 0;
    do {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d882;
      fdb_doc_free(apfStack_1148[lVar16]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 100);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d890;
    fdb_shutdown();
    pfStack_15c0 = (fdb_kvs_handle *)0x10d895;
    memleak_end();
    pcVar22 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar22 = "%s FAILED\n";
    }
    pfStack_15c0 = (fdb_kvs_handle *)0x10d8c6;
    fprintf(_stderr,pcVar22,"compact reopen named kvs");
    return;
  }
  pfStack_15c0 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8fa;
  ppfStack_15e8 = &pfStack_15b0;
  pbStack_15e0 = unaff_R12;
  sStack_15d8 = unaff_R13;
  pfStack_15d0 = &fStack_15a0;
  ppfStack_15c8 = &pfStack_15a8;
  pfStack_15c0 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1a88 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8ff;
  memleak_start();
  pfStack_1aa0 = (fdb_kvs_handle *)0x0;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d924;
  fdb_get_default_config();
  pfVar7 = (fdb_kvs_handle *)auStack_1a88;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d931;
  fdb_get_default_kvs_config();
  fStack_19e8.wal_threshold = 0x400;
  fStack_19e8.flags = 1;
  fStack_19e8.compaction_threshold = '\0';
  pbVar31 = (btree *)auStack_1a98;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_19e8);
  ppfVar18 = &pfStack_1ab0;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)auStack_1a98._0_8_,ppfVar18,"db",(fdb_kvs_config *)pfVar7);
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d98b;
  pfVar27 = pfStack_1ab0;
  fVar4 = fdb_set_log_callback(pfStack_1ab0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar20 = (uint)pfVar27;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (btree *)0x0;
    uVar15 = 0;
    do {
      pfVar1 = &fStack_17f0.config.encryption_key;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9b3;
      sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9cb;
      sprintf((char *)&fStack_17f0,"meta%d",uVar15 & 0xffffffff);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9e3;
      sprintf(acStack_18f0,"body%d",uVar15 & 0xffffffff);
      pbVar31 = (btree *)(&bStack_1a60.ksize + (long)unaff_R12);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9f3;
      unaff_R13 = strlen((char *)pfVar1);
      unaff_RBP = &fStack_17f0;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da06;
      pfVar7 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da16;
      sVar6 = strlen(acStack_18f0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar31,&fStack_17f0.config.encryption_key,unaff_R13,unaff_RBP,
                     (size_t)pfVar7,acStack_18f0,sVar6);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da4a;
      fdb_set(pfStack_1ab0,*(fdb_doc **)(&bStack_1a60.ksize + uVar15 * 8));
      uVar15 = uVar15 + 1;
      unaff_R12 = (btree *)((long)unaff_R12 + 8);
    } while (uVar15 != 9);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da67;
    fdb_commit((fdb_file_handle *)auStack_1a98._0_8_,'\0');
    ppfVar18 = (fdb_kvs_handle **)(auStack_1a98 + 8);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar18,"./compact_test1",&fStack_19e8);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da92;
    pfVar23 = (fdb_file_handle *)auStack_1a98._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_1a98._8_8_,"./compact_test2");
    uVar20 = (uint)pfVar23;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pfStack_1ac8 = (fdb_kvs_handle *)0x10daa4;
    fdb_close((fdb_file_handle *)auStack_1a98._8_8_);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dac4;
    pfVar27 = pfStack_1ab0;
    fVar4 = fdb_iterator_init(pfStack_1ab0,&pfStack_1aa8,(void *)0x0,0,(void *)0x0,0,0);
    uVar20 = (uint)pfVar27;
    pfVar27 = pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    unaff_R13 = 0;
    ppfVar18 = &pfStack_1aa0;
    do {
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dae1;
      fVar4 = fdb_iterator_get(pfStack_1aa8,(fdb_doc **)ppfVar18);
      pfVar27 = pfStack_1aa0;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dcb0;
        pbVar25 = unaff_R12;
        compact_reopen_with_iterator();
        uVar20 = (uint)pbVar25;
        goto LAB_0010dcb0;
      }
      pbVar31 = (btree *)pfStack_1aa0->op_stats;
      unaff_RBP = *(fdb_kvs_handle **)(&bStack_1a60.ksize + unaff_R13 * 8);
      unaff_R12 = (btree *)unaff_RBP->op_stats;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db09;
      iVar5 = bcmp(pbVar31,unaff_R12,*(size_t *)&pfStack_1aa0->kvs_config);
      pfVar7 = pfVar27;
      if (iVar5 != 0) {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar31 = pfVar27->staletree;
      unaff_R12 = unaff_RBP->staletree;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db28;
      iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar27->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dca5;
      pbVar31 = (pfVar27->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db47;
      iVar5 = bcmp(pbVar31,unaff_R12,(size_t)(pfVar27->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc9a;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar27);
      pfStack_1aa0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db6d;
      pfVar24 = pfStack_1aa8;
      fVar4 = fdb_iterator_next(pfStack_1aa8);
      uVar20 = (uint)pfVar24;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dcbf;
    pfStack_1ac8 = (fdb_kvs_handle *)0x10db8a;
    fVar4 = fdb_iterator_close(pfStack_1aa8);
    uVar20 = (uint)pfStack_1aa8;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbaa;
      fdb_get_kvs_info(pfStack_1ab0,&fStack_1a18);
      lVar16 = (long)(int)fStack_1a18.doc_count;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbb6;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbc4;
      fdb_close((fdb_file_handle *)auStack_1a98._0_8_);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbdb;
      fdb_open((fdb_file_handle **)auStack_1a98,"./compact_test2",&fStack_19e8);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)auStack_1a98._0_8_,&pfStack_1ab0,"db",
                   (fdb_kvs_config *)auStack_1a88);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbfe;
      fdb_get_kvs_info(pfStack_1ab0,&fStack_1a18);
      if (lVar16 != CONCAT44(fStack_1a18.doc_count._4_4_,(int)fStack_1a18.doc_count)) {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc1e;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc28;
      fdb_close((fdb_file_handle *)auStack_1a98._0_8_);
      lVar16 = 0;
      do {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_1a60.ksize + lVar16 * 8));
        lVar16 = lVar16 + 1;
      } while (lVar16 != 9);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc42;
      fdb_shutdown();
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc47;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc78;
      fprintf(_stderr,pcVar22,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dcb0:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar27 = pfVar7;
LAB_0010dcba:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pfStack_1ac8 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_28e0 = (code *)0x10dceb;
  ppfStack_1af0 = ppfVar18;
  pbStack_1ae8 = unaff_R12;
  sStack_1ae0 = unaff_R13;
  pfStack_1ad8 = pfVar27;
  pbStack_1ad0 = pbVar31;
  pfStack_1ac8 = unaff_RBP;
  gettimeofday(&tStack_2868,(__timezone_ptr_t)0x0);
  pcStack_28e0 = (code *)0x10dcf0;
  memleak_start();
  pcStack_28e0 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_28e0 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_2550.buffercache_size = 0;
  fStack_2550.wal_threshold = 0x32;
  fStack_2550.flags = 1;
  fStack_2550.compaction_threshold = '\0';
  fStack_2550.block_reusing_threshold = 0;
  pcStack_28e0 = (code *)0x10dd38;
  fStack_2550.multi_kv_instances = (bool)(char)uVar20;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_28e0 = (code *)0x10dd4c;
  fdb_open(&pfStack_28c8,"./compact_test1",&fStack_2550);
  uStack_28ac = uVar20;
  if (uVar20 == 0) {
    pcStack_28e0 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_28c8,apfStack_28a8,&fStack_2888);
    sVar17 = 1;
  }
  else {
    ppfVar18 = apfStack_28a8;
    uVar15 = 0;
    do {
      pcStack_28e0 = (code *)0x10dd7d;
      sprintf(acStack_2870,"kv%d",uVar15 & 0xffffffff);
      pcStack_28e0 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_28c8,ppfVar18,acStack_2870,&fStack_2888);
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    sVar17 = 4;
  }
  uVar15 = 0;
  do {
    pcStack_28e0 = (code *)0x10dddc;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10ddf5;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10de0e;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10de21;
    sVar6 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10de34;
    sVar8 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10de44;
    sVar9 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10de69;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar6,acStack_2758,sVar8,acStack_2858,sVar9);
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10de7a;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x4b);
  pcStack_28e0 = (code *)0x10de9e;
  fdb_commit(pfStack_28c8,'\x01');
  uVar15 = 0x4b;
  do {
    pcStack_28e0 = (code *)0x10dec0;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10ded9;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10def2;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10df05;
    sVar6 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10df18;
    sVar8 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10df28;
    sVar9 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10df4d;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar6,acStack_2758,sVar8,acStack_2858,sVar9);
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10df5e;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x96);
  lVar16 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10df8e;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[lVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x4b);
  lVar16 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10dfb7;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[lVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x4b);
  pcStack_28e0 = (code *)0x10dfd4;
  fdb_commit(pfStack_28c8,'\0');
  uVar15 = 0x96;
  do {
    pcStack_28e0 = (code *)0x10dff6;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e00f;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e028;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e03b;
    sVar6 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10e04e;
    sVar8 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10e05e;
    sVar9 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10e083;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar6,acStack_2758,sVar8,acStack_2858,sVar9);
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10e094;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xe1);
  pcStack_28e0 = (code *)0x10e0bb;
  fdb_commit(pfStack_28c8,'\x01');
  uVar15 = 0xe1;
  do {
    pcStack_28e0 = (code *)0x10e0dd;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e0f6;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e10f;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    ppfVar35 = apfStack_2458 + uVar15;
    pcStack_28e0 = (code *)0x10e122;
    sVar6 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10e135;
    sVar8 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10e145;
    sVar9 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10e16a;
    fdb_doc_create(ppfVar35,acStack_2658,sVar6,acStack_2758,sVar8,acStack_2858,sVar9);
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10e17b;
      fdb_set(apfStack_28a8[sVar32],*ppfVar35);
      sVar32 = sVar32 + 1;
    } while (sVar17 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 300);
  sVar32 = 0;
  pcStack_28e0 = (code *)0x10e1a2;
  fdb_commit(pfStack_28c8,'\0');
  do {
    pfVar7 = apfStack_28a8[sVar32];
    pcStack_28e0 = (code *)0x10e1c0;
    fVar4 = fdb_set_log_callback(pfVar7,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_28e0 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar32 = sVar32 + 1;
  } while (sVar17 != sVar32);
  pcStack_28e0 = (code *)0x10e1e4;
  pfVar23 = pfStack_28c8;
  fVar4 = fdb_get_all_snap_markers(pfStack_28c8,&pfStack_28c0,&uStack_28b8);
  iVar5 = (int)pfVar23;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar6 = (size_t)uStack_28ac;
    cVar19 = (char)uStack_28ac;
    uVar11 = uStack_28b8;
    if (cVar19 != '\0') {
      if (uStack_28b8 != 8) {
        pcStack_28e0 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_28e0 = (code *)0x10e21d;
      sVar17 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[1].marker);
      pcStack_28e0 = (code *)0x10e233;
      sVar10 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[2].marker);
      if (sVar10 <= sVar17) {
        pcStack_28e0 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar11 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_28e0 = (code *)0x10e28e;
      fVar4 = fdb_free_snap_markers(pfStack_28c0,uStack_28b8);
      iVar5 = (int)pfStack_28c0;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_28e0 = (code *)0x10e2a0;
        fdb_close(pfStack_28c8);
        lVar16 = 0;
        do {
          pcStack_28e0 = (code *)0x10e2af;
          fdb_doc_free(apfStack_2458[lVar16]);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 300);
        pcStack_28e0 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_28e0 = (code *)0x10e2c5;
        memleak_end();
        pcVar22 = "single kv mode:";
        if (cVar19 != '\0') {
          pcVar22 = "multiple kv mode:";
        }
        pcStack_28e0 = (code *)0x10e2f3;
        sprintf(acStack_2858,"estimate space upto marker in file test %s",pcVar22);
        pcVar22 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pcStack_28e0 = (code *)0x10e320;
        fprintf(_stderr,pcVar22,acStack_2858);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar11 != 4) {
      pcStack_28e0 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_28e0 = (code *)0x10e260;
    sVar17 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[1].marker);
    pcStack_28e0 = (code *)0x10e276;
    pfVar23 = pfStack_28c8;
    sVar10 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[2].marker);
    iVar5 = (int)pfVar23;
    if (sVar17 < sVar10) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_28e0 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_28e0 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_28e0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_28e8 = logCallbackFunc;
  pcStack_28f0 = "estimate_space_upto_test";
  pfStack_2e68 = (fdb_kvs_handle *)0x10e36b;
  sStack_2908 = sVar17;
  sStack_2900 = sVar32;
  ppfStack_28f8 = ppfVar35;
  pcStack_28e0 = (code *)sVar6;
  gettimeofday(&tStack_2db0,(__timezone_ptr_t)0x0);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_2e68 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_2e68 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_29f8 = 0;
  uStack_29f0 = 0x400;
  uStack_29dc = 1;
  uStack_29d1 = 0;
  uStack_2948 = 0;
  pfStack_2e68 = (fdb_kvs_handle *)0x10e3bb;
  uStack_29c0 = (char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2e68 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_2e48,"./compact_test1",(fdb_config *)(auStack_2c00 + 0x200));
  iStack_2e34 = iVar5;
  if (iVar5 == 0) {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_2e48,(fdb_kvs_handle **)(auStack_2e30 + 0x20),&fStack_2dc8);
    uVar20 = 1;
  }
  else {
    ppfVar18 = (fdb_kvs_handle **)(auStack_2e30 + 0x20);
    uVar15 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_2e30,"kv%d",uVar15 & 0xffffffff);
      pfStack_2e68 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_2e48,ppfVar18,auStack_2e30,&fStack_2dc8);
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    uVar20 = 4;
  }
  pcVar22 = (char *)(ulong)uVar20;
  uVar15 = 0;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_2c00 + 0x100,"key%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_2c00,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_2da0,"body%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4a9;
    sVar6 = strlen(auStack_2c00 + 0x100);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4bc;
    sVar8 = strlen(auStack_2c00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4cc;
    sVar9 = strlen(acStack_2da0);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_2ca0 + uVar15,auStack_2c00 + 0x100,sVar6,auStack_2c00,sVar8,acStack_2da0
                   ,sVar9);
    lVar16 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar16 * 8 + 0x20),apfStack_2ca0[uVar15]);
      lVar16 = lVar16 + 1;
    } while (pcVar22 != (char *)lVar16);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_2e48,'\x01');
  uVar15 = 5;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_2c00 + 0x100,"key%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_2c00,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_2da0,"body%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e588;
    sVar6 = strlen(auStack_2c00 + 0x100);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e59b;
    sVar8 = strlen(auStack_2c00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e5ab;
    sVar9 = strlen(acStack_2da0);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_2ca0 + uVar15,auStack_2c00 + 0x100,sVar6,auStack_2c00,sVar8,acStack_2da0
                   ,sVar9);
    lVar16 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar16 * 8 + 0x20),apfStack_2ca0[uVar15]);
      lVar16 = lVar16 + 1;
    } while (pcVar22 != (char *)lVar16);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_2e48,'\0');
  uVar15 = 10;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_2c00 + 0x100,"key%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_2c00,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_2da0,"body%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e665;
    sVar6 = strlen(auStack_2c00 + 0x100);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e678;
    sVar8 = strlen(auStack_2c00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e688;
    sVar9 = strlen(acStack_2da0);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_2ca0 + uVar15,auStack_2c00 + 0x100,sVar6,auStack_2c00,sVar8,acStack_2da0
                   ,sVar9);
    lVar16 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar16 * 8 + 0x20),apfStack_2ca0[uVar15]);
      lVar16 = lVar16 + 1;
    } while (pcVar22 != (char *)lVar16);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xf);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_2e48,'\x01');
  uVar15 = 0xf;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_2c00 + 0x100,"key%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_2c00,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_2da0,"body%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e745;
    pfVar7 = (fdb_kvs_handle *)strlen(auStack_2c00 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_2c00;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e758;
    sVar6 = strlen((char *)doc._M_i);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e768;
    sVar8 = strlen(acStack_2da0);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_2ca0 + uVar15,auStack_2c00 + 0x100,(size_t)pfVar7,(void *)doc._M_i,sVar6
                   ,acStack_2da0,sVar8);
    lVar16 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar16 * 8 + 0x20),apfStack_2ca0[uVar15]);
      lVar16 = lVar16 + 1;
    } while (pcVar22 != (char *)lVar16);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x14);
  pfVar27 = (fdb_kvs_handle *)0x0;
  pfStack_2e68 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_2e48,'\0');
  __s = logCallbackFunc;
  pcVar33 = "compact_upto_test";
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e7e0;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2e30 + (long)pfVar27 * 8 + 0x20),logCallbackFunc
                       ,"compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar22 != pfVar27);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e804;
  fVar4 = fdb_get_all_snap_markers
                    (pfStack_2e48,(fdb_snapshot_info_t **)&aStack_2e50.seqtree,
                     (uint64_t *)&pfStack_2e40);
  pcVar34 = pcVar33;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_2e34 == '\0') {
      if (pfStack_2e40 != (fdb_kvs_handle *)0x4) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e92b;
        compact_upto_test();
      }
      pfVar27 = (fdb_kvs_handle *)0x1400000000;
      doc._M_i = 0;
      pfVar7 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar22 = auStack_2e30 + 0x40;
      pcVar34 = (char *)0x0;
      aVar12 = aStack_2e50;
      do {
        if (*(long *)((long)&(aVar12.seqtree)->root_bid + doc._M_i) != 1) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e98d;
          compact_upto_test();
          aVar12 = aStack_2df0;
        }
        if (*(long *)(*(long *)((long)&(aVar12.seqtree)->blk_handle + doc._M_i) + 8) !=
            (long)pfVar27 >> 0x20) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e9a2;
          compact_upto_test();
          aVar12 = aStack_2df0;
        }
        pcVar34 = (char *)((long)pcVar34 + 1);
        pfVar27 = (fdb_kvs_handle *)(pfVar27[-0x2762763].config.encryption_key.bytes + 0x14);
        doc._M_i = doc._M_i + 0x18;
      } while (pcVar34 < pfStack_2e40);
      __s = (code *)(auStack_2e30 + 0x40);
      pfStack_2e68 = (fdb_kvs_handle *)0x10e9c4;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2e68 = (fdb_kvs_handle *)0x10e9da;
      fVar4 = fdb_compact_upto(pfStack_2e48,(char *)__s,
                               (fdb_snapshot_marker_t)(aStack_2e50.seqtree)->blk_ops);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e9fe;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e30._32_8_,
                                  (fdb_kvs_handle **)(auStack_2e30 + 0x18),
                                  (fdb_seqnum_t)(aStack_2e50.seqtrie)->btree_blk_ops->blk_alloc_sub)
        ;
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10ea07;
          compact_upto_test();
          goto LAB_0010ea07;
        }
LAB_0010ea64:
        __s = (code *)(auStack_2e30 + 0x40);
        pfStack_2e68 = (fdb_kvs_handle *)0x10ea6e;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2e30._24_8_);
        pfStack_2e68 = (fdb_kvs_handle *)0x10ea7d;
        fVar4 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStack_2e50.seqtree,(uint64_t)pfStack_2e40);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10ea8f;
          fdb_close(pfStack_2e48);
          lVar16 = 0;
          do {
            pfStack_2e68 = (fdb_kvs_handle *)0x10ea9e;
            fdb_doc_free(apfStack_2ca0[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x14);
          pfStack_2e68 = (fdb_kvs_handle *)0x10eaac;
          fdb_shutdown();
          pfStack_2e68 = (fdb_kvs_handle *)0x10eab1;
          memleak_end();
          pcVar22 = "single kv mode:";
          if ((char)iStack_2e34 != '\0') {
            pcVar22 = "multiple kv mode:";
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10eae1;
          sprintf(acStack_2da0,"compact upto marker in file test %s",pcVar22);
          pcVar22 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10eb0e;
          fprintf(_stderr,pcVar22,acStack_2da0);
          return;
        }
        goto LAB_0010eb34;
      }
      goto LAB_0010eb39;
    }
    if (pfStack_2e40 != (fdb_kvs_handle *)0x8) {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e82c;
      compact_upto_test();
    }
    auStack_2e30._8_8_ = ZEXT48(uVar20 + 1);
    doc._M_i = (__int_type_conflict)auStack_2e30;
    pcVar34 = (char *)0x0;
    do {
      __s = (code *)((long)pcVar34 * 3);
      aVar12 = aStack_2e50;
      if ((fdb_custom_cmp_variable)(&(aStack_2e50.seqtree)->root_bid)[(long)pcVar34 * 3] !=
          (fdb_custom_cmp_variable)auStack_2e30._8_8_) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e911;
        compact_upto_test();
        aVar12 = aStack_2df0;
      }
      pfVar7 = (fdb_kvs_handle *)((long)pcVar34 * -5 + 0x14);
      pfVar14 = (fdb_kvs_commit_marker_t *)(&(aVar12.seqtree)->blk_handle)[(long)pcVar34 * 3];
      pfVar27 = (fdb_kvs_handle *)0x8;
      pcVar33 = (char *)0x0;
      auStack_2e30._16_8_ = pcVar34;
      do {
        if (*(fdb_kvs_handle **)(&(pfVar27->kvs_config).create_if_missing + (long)pfVar14) != pfVar7
           ) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e8e2;
          compact_upto_test();
        }
        pfStack_2e68 = (fdb_kvs_handle *)0x10e892;
        sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar33 & 0xffffffff);
        pfVar14 = (fdb_kvs_commit_marker_t *)(&(aStack_2e50.seqtree)->blk_handle)[(long)pcVar34 * 3]
        ;
        psVar2 = *(short **)((long)&pfVar14[-1].seqnum + (long)pfVar27);
        if ((char)psVar2[1] != auStack_2e30[2] || *psVar2 != auStack_2e30._0_2_) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10eb2a;
          compact_upto_test();
          goto LAB_0010eb2a;
        }
        pcVar33 = pcVar33 + 1;
        pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).custom_cmp_param;
      } while (pcVar22 != pcVar33);
      pcVar34 = (char *)(auStack_2e30._16_8_ + 1);
    } while (pcVar34 != pcVar22);
LAB_0010ea07:
    __s = (code *)(auStack_2e30 + 0x40);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ea22;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2e68 = (fdb_kvs_handle *)0x10ea38;
    fVar4 = fdb_compact_upto(pfStack_2e48,(char *)__s,
                             (fdb_snapshot_marker_t)(aStack_2e50.seqtree)->blk_ops);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
    pfStack_2e68 = (fdb_kvs_handle *)0x10ea5c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e30._40_8_,
                              (fdb_kvs_handle **)(auStack_2e30 + 0x18),
                              (fdb_seqnum_t)(aStack_2e50.seqtrie)->btree_blk_ops->blk_read);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
  }
  else {
LAB_0010eb2f:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eb34;
    compact_upto_test();
LAB_0010eb34:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eb39;
    compact_upto_test();
LAB_0010eb39:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eb3e;
    compact_upto_test();
LAB_0010eb3e:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eb43;
    compact_upto_test();
  }
  pfStack_2e68 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_3350 = (fdb_kvs_handle *)0x10eb65;
  pcStack_2e90 = __s;
  pfStack_2e88 = pfVar27;
  pfStack_2e80 = (fdb_kvs_handle *)doc._M_i;
  pcStack_2e78 = pcVar22;
  pcStack_2e70 = pcVar34;
  pfStack_2e68 = pfVar7;
  gettimeofday((timeval *)(auStack_3300 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_3350 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_3350 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3350 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)auStack_3300;
  pfStack_3350 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_3290.buffercache_size = 0x1000000;
  fStack_3290.wal_threshold = 0x400;
  fStack_3290.flags = 1;
  fStack_3290.compaction_threshold = '\0';
  pbVar31 = (btree *)&pfStack_3330;
  pfStack_3350 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar31,"./compact_test1",&fStack_3290);
  ppfVar18 = &pfStack_3340;
  pfStack_3350 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_3330,ppfVar18,(fdb_kvs_config *)pfVar13);
  pfStack_3350 = (fdb_kvs_handle *)0x10ebee;
  fVar4 = fdb_set_log_callback(pfStack_3340,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_3350 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_3320,"./compact_test1",&fStack_3290);
    ppfVar18 = &pfStack_3328;
    pfStack_3350 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3320._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3300);
    pfStack_3350 = (fdb_kvs_handle *)0x10ec3d;
    fVar4 = fdb_set_log_callback(pfStack_3328,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_3350 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_2f98,"key%d",0);
    pfStack_3350 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_3098,"meta%d",0);
    pbVar31 = abStack_3198;
    pfStack_3350 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar31,"body%d",0);
    pfStack_3350 = (fdb_kvs_handle *)0x10ec9e;
    sVar6 = strlen(acStack_2f98);
    pfStack_3350 = (fdb_kvs_handle *)0x10eca9;
    sVar8 = strlen(acStack_3098);
    pfStack_3350 = (fdb_kvs_handle *)0x10ecb4;
    sVar9 = strlen((char *)pbVar31);
    pfStack_3350 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_3320 + 8),acStack_2f98,sVar6,acStack_3098,sVar8,pbVar31,
                   sVar9);
    pfStack_3350 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_3340,(fdb_doc *)auStack_3320._8_8_);
    pfStack_3350 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_2f98,"key%d",1);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_3098,"meta%d",1);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar31,"body%d",1);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed2c;
    sVar6 = strlen(acStack_2f98);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed37;
    sVar8 = strlen(acStack_3098);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed42;
    sVar9 = strlen((char *)pbVar31);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_3320 + 0x10),acStack_2f98,sVar6,acStack_3098,sVar8,pbVar31,
                   sVar9);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_3340,(fdb_doc *)auStack_3320._16_8_);
    pfStack_3350 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_3338,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_3320._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_3320._16_8_,
                   *(btree_print_func **)(auStack_3320._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_3320._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_3338->file = true;
    pfStack_3350 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_3340,(fdb_doc *)pfStack_3338);
    pfStack_3350 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_3338);
    pfStack_3350 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_3330,'\x01');
    pfStack_3350 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_3330,"./compact_test2");
    pfStack_3350 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_3350 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_2f98,"key%d",2);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_3098,"meta%d",2);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar31,"body%d",2);
    pfVar27 = (fdb_kvs_handle *)(auStack_3320 + 0x18);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_2f98);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee3b;
    pfVar7 = (fdb_kvs_handle *)strlen(acStack_3098);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee46;
    sVar6 = strlen((char *)pbVar31);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar27,acStack_2f98,doc._M_i,acStack_3098,(size_t)pfVar7,pbVar31,
                   sVar6);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_3340,(fdb_doc *)auStack_3320._24_8_);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_3330,'\x01');
    pfStack_3350 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_3340);
    ppfVar18 = &pfStack_3328;
    pfStack_3350 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_3328);
    pfStack_3350 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_3330);
    pfVar13 = (fdb_kvs_handle *)auStack_3320;
    pfStack_3350 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_3320._0_8_);
    pfStack_3350 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_3350 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar13,"./compact_test1",&fStack_3290);
    pfStack_3350 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3320._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3300);
    pfStack_3350 = (fdb_kvs_handle *)0x10eef5;
    fVar4 = fdb_set_log_callback(pfStack_3328,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar18 = &pfStack_3338;
      while( true ) {
        pfStack_3350 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_3320 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_3320 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_3350 = (fdb_kvs_handle *)0x10ef38;
        fVar4 = fdb_get(pfStack_3328,(fdb_doc *)pfStack_3338);
        pfVar26 = pfStack_3338;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_3350 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar26);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar13 = pfVar26;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_3350 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_3320._0_8_,&fStack_32d8);
          pfStack_3350 = (fdb_kvs_handle *)0x10efd4;
          iVar5 = strcmp("./compact_test2",fStack_32d8.filename);
          if (iVar5 != 0) {
            pfStack_3350 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_3350 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_3328);
          pfStack_3350 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_3320._0_8_);
          lVar16 = 0;
          do {
            pfStack_3350 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_3320 + lVar16 * 8 + 8));
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          pfStack_3350 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_3350 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_3350 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar22,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar31 = pfStack_3338->staletree;
        pfVar7 = *(fdb_kvs_handle **)(auStack_3320 + doc._M_i * 8 + 8);
        pfVar27 = (fdb_kvs_handle *)pfVar7->staletree;
        pfStack_3350 = (fdb_kvs_handle *)0x10ef77;
        iVar5 = bcmp(pbVar31,pfVar27,(size_t)(pfStack_3338->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar31 = (pfVar26->field_6).seqtree;
          pfVar27 = (fdb_kvs_handle *)(pfVar7->field_6).seqtree;
          pfStack_3350 = (fdb_kvs_handle *)0x10ef96;
          iVar5 = bcmp(pbVar31,pfVar27,(size_t)(pfVar26->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010ef9e;
          pfStack_3350 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar13 = pfVar26;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar26 = pfVar13;
        pfStack_3350 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_3350 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar13 = pfVar26;
LAB_0010f073:
      pfStack_3350 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_3350 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_3350 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_3350 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_38b8 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_3378 = ppfVar18;
  pfStack_3370 = pfVar27;
  pfStack_3368 = (fdb_kvs_handle *)doc._M_i;
  pfStack_3360 = pfVar13;
  pbStack_3358 = pbVar31;
  pfStack_3350 = pfVar7;
  gettimeofday(&tStack_3828,(__timezone_ptr_t)0x0);
  pfStack_38b8 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_38b8 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_38b8 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)auStack_3818;
  pfStack_38b8 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_3470.buffercache_size = 0x1000000;
  fStack_3470.wal_threshold = 0x400;
  fStack_3470.flags = 1;
  fStack_3470.compaction_threshold = '\0';
  ppfVar35 = &pfStack_3890;
  pfStack_38b8 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar35,"./compact_test1",&fStack_3470);
  ptr_handle = (list *)(auStack_38a0 + 8);
  pfStack_38b8 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_3890,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar13
            );
  pfStack_38b8 = (fdb_kvs_handle *)0x10f133;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_38a0._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar27 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_38b8 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_3600,"key%d",uVar15 & 0xffffffff);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_3818 + 0x118,"meta%d",uVar15 & 0xffffffff);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_3818 + 0x18,"body%d",uVar15 & 0xffffffff);
      ppfVar35 = (fdb_doc **)((long)apfStack_3880 + (long)pfVar27);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_3600);
      pfVar7 = (fdb_kvs_handle *)(auStack_3818 + 0x118);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f1ae;
      pfVar13 = (fdb_kvs_handle *)strlen((char *)pfVar7);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f1be;
      sVar6 = strlen(auStack_3818 + 0x18);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar35,acStack_3600,doc._M_i,pfVar7,(size_t)pfVar13,auStack_3818 + 0x18,sVar6
                    );
      pfStack_38b8 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_38a0._8_8_,apfStack_3880[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar27 = (fdb_kvs_handle *)((long)pfVar27 + 8);
    } while (uVar15 != 10);
    pfStack_38b8 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_3890,'\x01');
    pfStack_38b8 = (fdb_kvs_handle *)0x10f226;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_38a0._8_8_,&pfStack_3888,10);
    ptr_handle = (list *)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_38b8 = (fdb_kvs_handle *)0x10f23f;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_3890,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar13 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_38b8 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_38a0,apfStack_3880[(long)pfVar13]->key,
                       apfStack_3880[(long)pfVar13]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_38b8 = (fdb_kvs_handle *)0x10f282;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_38a0._8_8_,(fdb_doc *)auStack_38a0._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_38b8 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_38b8 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_38a0._0_8_);
        pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
      } while (pfVar13 != (fdb_kvs_handle *)0xa);
      pfStack_38b8 = (fdb_kvs_handle *)0x10f2b1;
      iVar5 = stat("./compact_test1",&sStack_3500);
      if (iVar5 == 0) {
        pfStack_38b8 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar13 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_38b8 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_38a0,apfStack_3880[(long)pfVar13]->key,
                       apfStack_3880[(long)pfVar13]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_38b8 = (fdb_kvs_handle *)0x10f2f5;
        fVar4 = fdb_get(pfStack_3888,(fdb_doc *)auStack_38a0._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_38b8 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_38a0._0_8_);
        pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
        if (pfVar13 == (fdb_kvs_handle *)0xa) {
          pfStack_38b8 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_3890);
          pfStack_38b8 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar16 = 0;
          do {
            pfStack_38b8 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_3880[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 10);
          pfStack_38b8 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_38b8 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar22,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_38a0;
      pfStack_38b8 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_38b8 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_38b8 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_38b8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_4060 = (fdb_kvs_handle *)0x10f3b5;
  fStack_3ac8.bub_ctx.entries = ptr_handle;
  fStack_3ac8.bub_ctx.num_entries = (uint64_t)pfVar27;
  fStack_3ac8.bub_ctx.space_used = doc._M_i;
  fStack_3ac8.bub_ctx.handle = pfVar13;
  ppfStack_38c0 = ppfVar35;
  pfStack_38b8 = pfVar7;
  gettimeofday(&tStack_3fc8,(__timezone_ptr_t)0x0);
  pfStack_4060 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_4060 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_4060 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_4010;
  pfStack_4060 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_3eb8._256_8_ = 0x1000000;
  auStack_3eb8._264_8_ = 0x400;
  auStack_3eb8._284_4_ = 1;
  auStack_3eb8[0x127] = 0;
  pfVar13 = (fdb_kvs_handle *)(auStack_4038 + 0x18);
  pfStack_4060 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar13,"./compact_test1",(fdb_config *)(auStack_3eb8 + 0xf8));
  ppfVar18 = (fdb_kvs_handle **)(auStack_4038 + 8);
  pfStack_4060 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_4038._24_8_,ppfVar18,(char *)0x0,kvs_config_00);
  pfStack_4060 = (fdb_kvs_handle *)0x10f440;
  pfVar26 = (fdb_kvs_handle *)auStack_4038._8_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4038._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar27 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_3bc8,"key%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_3eb8 + 0x1f0,"meta%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_3fb8,"body%d",uVar15 & 0xffffffff);
      pfVar13 = (fdb_kvs_handle *)(auStack_3eb8 + (long)pfVar27);
      pfStack_4060 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_3bc8);
      pfVar7 = (fdb_kvs_handle *)(auStack_3eb8 + 0x1f0);
      pfStack_4060 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar7);
      pfStack_4060 = (fdb_kvs_handle *)0x10f4ce;
      sVar6 = strlen(acStack_3fb8);
      pfStack_4060 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar13,acStack_3bc8,doc._M_i,pfVar7,(size_t)kvs_config_00,
                     acStack_3fb8,sVar6);
      pfStack_4060 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_4038._8_8_,*(fdb_doc **)(auStack_3eb8 + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pfVar27 = (fdb_kvs_handle *)((long)pfVar27 + 8);
    } while (uVar15 != 0x1e);
    pfStack_4060 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_4038._24_8_,'\0');
    pfStack_4060 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_4038 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_3eb8 + 0xf8));
    ppfVar18 = (fdb_kvs_handle **)auStack_4048;
    pfStack_4060 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._16_8_,ppfVar18,(char *)0x0,&fStack_4010);
    pfStack_4060 = (fdb_kvs_handle *)0x10f56b;
    pfVar26 = (fdb_kvs_handle *)auStack_4048._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4048._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar27 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_3bc8,"k2ey%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_3eb8 + 0x1f0,"m2eta%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_3fb8,"b2ody%d",uVar15 & 0xffffffff);
      pfVar13 = (fdb_kvs_handle *)(&fStack_3ac8.kvs_config.create_if_missing + (long)pfVar27);
      pfStack_4060 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_3bc8);
      pfVar7 = (fdb_kvs_handle *)(auStack_3eb8 + 0x1f0);
      pfStack_4060 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar7);
      pfStack_4060 = (fdb_kvs_handle *)0x10f5f9;
      sVar6 = strlen(acStack_3fb8);
      pfStack_4060 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar13,acStack_3bc8,doc._M_i,pfVar7,(size_t)kvs_config_00,
                     acStack_3fb8,sVar6);
      pfStack_4060 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_4048._0_8_,
              *(fdb_doc **)(&fStack_3ac8.kvs_config.create_if_missing + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pfVar27 = (fdb_kvs_handle *)((long)pfVar27 + 8);
    } while (uVar15 != 0x3c);
    pfStack_4060 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_4038._16_8_,'\0');
    pfStack_4060 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_4048._0_8_,&fStack_3ff8);
    if ((filemgr *)fStack_3ff8.last_seqnum != (filemgr *)0x3c) {
      pfStack_4060 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_4060 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4048._0_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_4038._16_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f68c;
    pfVar26 = (fdb_kvs_handle *)auStack_4038._24_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_4038._24_8_,(char *)0x0);
    ppfVar18 = (fdb_kvs_handle **)0x3c;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_4038 + 8);
    pfStack_4060 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4038._8_8_);
    pfVar13 = (fdb_kvs_handle *)(auStack_4038 + 0x18);
    pfStack_4060 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_4038._24_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar13,"./compact_test1",(fdb_config *)(auStack_3eb8 + 0xf8));
    pfStack_4060 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_4010);
    pfStack_4060 = (fdb_kvs_handle *)0x10f6ed;
    pfVar26 = (fdb_kvs_handle *)auStack_4038._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4038._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar18 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_4048 + 8);
    pfVar13 = (fdb_kvs_handle *)auStack_4038;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_3eb8 + (long)ppfVar18))[4],
                     **(size_t **)(auStack_3eb8 + (long)ppfVar18),(void *)0x0,0,(void *)0x0,0);
      pfStack_4060 = (fdb_kvs_handle *)0x10f737;
      pfVar26 = (fdb_kvs_handle *)auStack_4038._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_4038._8_8_,(fdb_doc *)auStack_4048._8_8_);
      pfVar21 = (fdb_kvs_handle *)auStack_4048._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_3eb8 + (long)ppfVar18);
      pfVar27 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_4060 = (fdb_kvs_handle *)0x10f765;
      iVar5 = bcmp(*(btree **)(auStack_4048._8_8_ + 0x38),pfVar27->staletree,
                   (size_t)((fdb_kvs_config *)auStack_4048._8_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar21 = pfStack_4018;
        pfVar27 = (fdb_kvs_handle *)auStack_4038._0_8_;
      }
      pfStack_4060 = (fdb_kvs_handle *)0x10f77b;
      iVar5 = bcmp((pfVar21->field_6).seqtree,(pfVar27->field_6).seqtree,
                   (size_t)(pfVar21->kvs_config).custom_cmp_param);
      pfVar7 = pfVar21;
      if (iVar5 != 0) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar7 = (fdb_kvs_handle *)auStack_4038._0_8_;
      }
      pfStack_4060 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar7);
      ppfVar18 = ppfVar18 + 1;
    } while (ppfVar18 != (fdb_kvs_handle **)0xf0);
    pfStack_4060 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_4038 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_3eb8 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_4048;
    pfStack_4060 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_4010);
    pfStack_4060 = (fdb_kvs_handle *)0x10f817;
    pfVar26 = (fdb_kvs_handle *)auStack_4048._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4048._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4060 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_4048._0_8_,&fStack_3ff8);
      if ((filemgr *)fStack_3ff8.last_seqnum != (filemgr *)0x3c) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar7 = (fdb_kvs_handle *)0x0;
      ppfVar18 = (fdb_kvs_handle **)(auStack_4048 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_4038;
      while( true ) {
        psVar3 = *(size_t **)
                  (&fStack_3ac8.kvs_config.create_if_missing +
                  (long)&(pfVar7->kvs_config).create_if_missing);
        pfStack_4060 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar18,(void *)psVar3[4],*psVar3,(void *)0x0,0,(void *)0x0,0);
        pfStack_4060 = (fdb_kvs_handle *)0x10f884;
        pfVar26 = (fdb_kvs_handle *)auStack_4048._0_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_4048._0_8_,(fdb_doc *)auStack_4048._8_8_);
        pfVar21 = (fdb_kvs_handle *)auStack_4048._8_8_;
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfVar27 = (fdb_kvs_handle *)
                  (&fStack_3ac8.kvs_config.create_if_missing +
                  (long)&(pfVar7->kvs_config).create_if_missing);
        pfVar13 = *(fdb_kvs_handle **)&pfVar27->kvs_config;
        pfStack_4060 = (fdb_kvs_handle *)0x10f8b1;
        iVar5 = bcmp(*(btree **)(auStack_4048._8_8_ + 0x38),pfVar13->staletree,
                     (size_t)((fdb_kvs_config *)auStack_4048._8_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_4060 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar21 = pfStack_4018;
          pfVar13 = (fdb_kvs_handle *)auStack_4038._0_8_;
        }
        pfStack_4060 = (fdb_kvs_handle *)0x10f8c6;
        iVar5 = bcmp((pfVar21->field_6).seqtree,(pfVar13->field_6).seqtree,
                     (size_t)(pfVar21->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar21;
        if (iVar5 != 0) {
          pfStack_4060 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_4038._0_8_;
        }
        pfStack_4060 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
        if (pfVar7 == (fdb_kvs_handle *)0x1e0) {
          lVar16 = 0;
          do {
            pfStack_4060 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_3eb8 + lVar16 * 8));
            pfStack_4060 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_3ac8.kvs_config.create_if_missing + lVar16 * 8));
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x1e);
          lVar16 = 0;
          do {
            pfStack_4060 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_3ac8.config.encryption_key.bytes + lVar16 * 8 + -0x14)
                        );
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x1e);
          pfStack_4060 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4038._8_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_4038._24_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4048._0_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_4038._16_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_4060 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_4060 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar22,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_4060 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_4060 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_4060 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_4060 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_4060 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_4060 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_4088 = ppfVar18;
  pfStack_4080 = pfVar27;
  pfStack_4078 = (fdb_kvs_handle *)doc._M_i;
  pfStack_4070 = kvs_config_00;
  pfStack_4068 = pfVar13;
  pfStack_4060 = pfVar7;
  gettimeofday(&tStack_47b8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_47a8.buffercache_size = 0;
  fStack_47a8.wal_threshold = 0x400;
  fStack_47a8.compaction_threshold = '\0';
  if (pfVar26 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var28._M_i = (__int_type_conflict)&pfStack_4820;
    fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_47a8);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      _Var28._M_i = (__int_type_conflict)pfStack_4820;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4820,&pfStack_4818,&fStack_4800);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar16 = 0;
      uVar15 = 0;
      do {
        pfVar1 = &afStack_45b0[0].config.encryption_key;
        sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
        sprintf((char *)afStack_45b0,"meta%d",uVar15 & 0xffffffff);
        sprintf(acStack_46b0,"body%d",uVar15 & 0xffffffff);
        doc._M_i = strlen((char *)pfVar1);
        pfVar7 = afStack_45b0;
        sVar6 = strlen((char *)pfVar7);
        sVar8 = strlen(acStack_46b0);
        fdb_doc_create((fdb_doc **)((long)&afStack_45b0[0].bub_ctx.handle + lVar16),
                       &afStack_45b0[0].config.encryption_key,doc._M_i,pfVar7,sVar6,acStack_46b0,
                       sVar8);
        fdb_set(pfStack_4818,(fdb_doc *)(&afStack_45b0[0].bub_ctx.handle)[uVar15]);
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 8;
      } while (uVar15 != 100);
      fdb_commit((fdb_file_handle *)pfStack_4820,'\0');
      fdb_get_kvs_info(pfStack_4818,&fStack_47e8);
      if ((filemgr *)fStack_47e8.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar16 = 0;
      pfVar13 = (fdb_kvs_handle *)&plStack_4810;
      do {
        fdb_del(pfStack_4818,(fdb_doc *)(&afStack_45b0[0].bub_ctx.handle)[lVar16]);
        if (lVar16 == 0x32) {
          pthread_create((pthread_t *)pfVar13,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_4820);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 100);
      pthread_join((pthread_t)plStack_4810,&pvStack_4808);
      fdb_commit((fdb_file_handle *)pfStack_4820,'\x01');
      fdb_get_kvs_info(pfStack_4818,&fStack_47e8);
      if ((filemgr *)fStack_47e8.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_4818);
      _Var28._M_i = (__int_type_conflict)&pfStack_4820;
      fdb_close((fdb_file_handle *)pfStack_4820);
      fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_47a8);
      pfVar27 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var28._M_i = (__int_type_conflict)pfStack_4820;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4820,&pfStack_4818,&fStack_4800);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_4818,&fStack_47e8);
        if ((filemgr *)fStack_47e8.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar16 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_45b0[0].bub_ctx.handle)[lVar16]);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 100);
        fdb_kvs_close(pfStack_4818);
        fdb_close((fdb_file_handle *)pfStack_4820);
        fdb_shutdown();
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar22,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var28._M_i = (__int_type_conflict)&pfStack_4820;
    fVar4 = fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_47a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var28._M_i = (__int_type_conflict)pfStack_4820;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4820,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_4820);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_185e0 = (fdb_kvs_handle *)0x10fd83;
  auStack_185a8._8_8_ = _Var28._M_i;
  gettimeofday(&tStack_18440,(__timezone_ptr_t)0x0);
  pfStack_185e0 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_185e0 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar22 = auStack_18548;
  pfStack_185e0 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_185e0 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_18548._8_8_ = 0;
  aStack_18538.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_18524 = 1;
  uStack_1851a = 0x1e01;
  pfStack_18510 = (filemgr *)0x1;
  aStack_184d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar33 = auStack_185d0;
  pfStack_185e0 = (fdb_kvs_handle *)0x10fde7;
  fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)pcVar22);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    aStack_184d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_185e0 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_185d0,"compact_test",(fdb_config *)auStack_18548);
    pcVar22 = auStack_185c8;
    pfStack_185e0 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_185d0,(fdb_kvs_handle **)pcVar22,&fStack_18598);
    pfStack_185e0 = (fdb_kvs_handle *)0x10fe3f;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185c8,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_185e0 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar15 = 0;
    do {
      pfStack_185e0 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_18430 + 0x48,"key%04d",uVar15 & 0xffffffff);
      pfStack_185e0 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_181e8,"meta%04d",uVar15 & 0xffffffff);
      pfStack_185e0 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_182e8,"body%04d",uVar15 & 0xffffffff);
      pfVar27 = (fdb_kvs_handle *)(&afStack_180e8[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_185e0 = (fdb_kvs_handle *)0x10feba;
      sVar6 = strlen(auStack_18430 + 0x48);
      pfVar7 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_185e0 = (fdb_kvs_handle *)0x10fece;
      sVar6 = strlen(acStack_181e8);
      pfVar13 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_185e0 = (fdb_kvs_handle *)0x10fedf;
      sVar6 = strlen(acStack_182e8);
      pfStack_185e0 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar27,auStack_18430 + 0x48,(size_t)pfVar7,acStack_181e8,
                     (size_t)pfVar13,acStack_182e8,sVar6 + 1);
      pfStack_185e0 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_185c8,
              *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + uVar15 * 8));
      uVar15 = uVar15 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar15 != 10000);
    pcVar22 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_185d0,'\0');
    pfStack_185e0 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_185d0);
    pfStack_185e0 = (fdb_kvs_handle *)0x10ff5b;
    pcVar33 = pcVar22;
    fVar4 = fdb_open((fdb_file_handle **)pcVar22,"compact_test",(fdb_config *)auStack_18548);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_185e0 = (fdb_kvs_handle *)0x10ff77;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d0,(fdb_kvs_handle **)auStack_185c8,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_185e0 = (fdb_kvs_handle *)0x10ff97;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185c8,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar22 = auStack_18430;
    pfStack_185e0 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_185d0,(fdb_file_info *)pcVar22);
    pfStack_185e0 = (fdb_kvs_handle *)0x10ffc3;
    iVar5 = strcmp((char *)auStack_18430._0_8_,"compact_test");
    if (iVar5 != 0) {
      pfStack_185e0 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_18430 + 0x48);
    pfVar13 = (fdb_kvs_handle *)auStack_185b8;
    pfVar27 = (fdb_kvs_handle *)0x0;
    _Var28._M_i = doc._M_i;
    do {
      pfStack_185e0 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar27 & 0xffffffff);
      pfStack_185e0 = (fdb_kvs_handle *)0x110000;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_185e0 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar13,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_185e0 = (fdb_kvs_handle *)0x11002e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185c8,(fdb_doc *)auStack_185b8._0_8_);
      doc._M_i = auStack_185b8._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_185e0 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar7 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_185b8._0_8_ + 0x40))->
               seqtree;
      pcVar22 = *(char **)(*(long *)(&afStack_180e8[0].kvs_config.create_if_missing +
                                    (long)pfVar27 * 8) + 0x40);
      pfStack_185e0 = (fdb_kvs_handle *)0x11005a;
      iVar5 = bcmp(pfVar7,pcVar22,(size_t)*(void **)(auStack_185b8._0_8_ + 0x10));
      _Var28._M_i = doc._M_i;
      if (iVar5 != 0) {
        pfStack_185e0 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_185e0 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).field_0x1;
    } while (pfVar27 != (fdb_kvs_handle *)0x2710);
    pfStack_185e0 = (fdb_kvs_handle *)0x11008e;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_185c8,(fdb_kvs_handle **)&aStack_18580,10000
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_185e0 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_18580.super___atomic_base<unsigned_long>._M_i);
    pcVar22 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_185d0);
    pfStack_185e0 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_185e0 = (fdb_kvs_handle *)0x1100d0;
    pcVar33 = pcVar22;
    fVar4 = fdb_open((fdb_file_handle **)pcVar22,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_185e0 = (fdb_kvs_handle *)0x1100ec;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d0,(fdb_kvs_handle **)auStack_185c8,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_185e0 = (fdb_kvs_handle *)0x11010c;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185c8,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_18430 + 0x48);
    pfVar13 = (fdb_kvs_handle *)auStack_185b8;
    pfVar27 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_185e0 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar27 & 0xffffffff);
      pfStack_185e0 = (fdb_kvs_handle *)0x110140;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_185e0 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar13,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_185e0 = (fdb_kvs_handle *)0x11016e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185c8,(fdb_doc *)auStack_185b8._0_8_);
      _Var28._M_i = auStack_185b8._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar7 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_185b8._0_8_ + 0x40))->
               seqtree;
      pcVar22 = *(char **)(*(long *)(&afStack_180e8[0].kvs_config.create_if_missing +
                                    (long)pfVar27 * 8) + 0x40);
      pfStack_185e0 = (fdb_kvs_handle *)0x11019a;
      iVar5 = bcmp(pfVar7,pcVar22,(size_t)*(void **)(auStack_185b8._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108a3;
      pfStack_185e0 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var28._M_i);
      pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).field_0x1;
      doc._M_i = _Var28._M_i;
    } while (pfVar27 != (fdb_kvs_handle *)0x2710);
    pcVar22 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_185d0);
    pfStack_185e0 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_185e0 = (fdb_kvs_handle *)0x1101ea;
    pcVar33 = pcVar22;
    fVar4 = fdb_open((fdb_file_handle **)pcVar22,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110206;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d0,(fdb_kvs_handle **)auStack_185c8,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_185e0 = (fdb_kvs_handle *)0x110226;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185c8,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_18430 + 0x48);
    pfVar13 = (fdb_kvs_handle *)auStack_185b8;
    pfVar27 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_185e0 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar27 & 0xffffffff);
      pfStack_185e0 = (fdb_kvs_handle *)0x11025a;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_185e0 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar13,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_185e0 = (fdb_kvs_handle *)0x110288;
      pcVar33 = (char *)auStack_185c8;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185c8,(fdb_doc *)auStack_185b8._0_8_);
      _Var28._M_i = auStack_185b8._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar7 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_185b8._0_8_ + 0x40))->
               seqtree;
      pcVar22 = *(char **)(*(long *)(&afStack_180e8[0].kvs_config.create_if_missing +
                                    (long)pfVar27 * 8) + 0x40);
      pfStack_185e0 = (fdb_kvs_handle *)0x1102b4;
      iVar5 = bcmp(pfVar7,pcVar22,(size_t)*(void **)(auStack_185b8._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108b3;
      pfStack_185e0 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var28._M_i);
      pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).field_0x1;
      doc._M_i = _Var28._M_i;
    } while (pfVar27 != (fdb_kvs_handle *)0x2710);
    pfStack_185e0 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_185d0);
    pcVar33 = auStack_185a8;
    pfStack_185e0 = (fdb_kvs_handle *)0x1102f7;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_less",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_185e0 = (fdb_kvs_handle *)0x110313;
    pcVar33 = (char *)auStack_185a8._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185a8._0_8_,
                       (fdb_kvs_handle **)&aStack_18568.seqtree,&fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_1851a = uStack_1851a & 0xff;
    pcVar33 = auStack_185b8 + 8;
    pfStack_185e0 = (fdb_kvs_handle *)0x110338;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_185e0 = (fdb_kvs_handle *)0x110354;
    pcVar33 = (char *)auStack_185b8._8_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185b8._8_8_,(fdb_kvs_handle **)&_Stack_18570,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_1851a = uStack_1851a & 0xff00;
    pcVar33 = auStack_185c0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110379;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_185e0 = (fdb_kvs_handle *)0x110395;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185c0,(fdb_kvs_handle **)&aStack_18578.seqtree,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_1851a = 0x1e01;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x1103bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_185e0 = (fdb_kvs_handle *)0x1103d8;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d0,(fdb_kvs_handle **)auStack_185c8,
                       &fStack_18598);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_185e0 = (fdb_kvs_handle *)0x1103f8;
    pcVar33 = (char *)auStack_185c8;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185c8,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var28._M_i = 0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar22 = auStack_18450;
    pfStack_185e0 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar22,(__timezone_ptr_t)0x0);
    tVar37.tv_usec = auStack_18450._8_8_;
    tVar37.tv_sec = auStack_18450._0_8_;
    pfVar27 = (fdb_kvs_handle *)auStack_18558;
    while( true ) {
      pfStack_185e0 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_185c8,
              *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_185e0 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_185d0,'\0');
      if ((ushort)((ushort)((short)_Var28._M_i * 0x5c29) >> 2 | (short)_Var28._M_i * 0x4000) < 0x290
         ) {
        pfStack_185e0 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_18568.seqtree,
                *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + _Var28._M_i * 8));
        pfStack_185e0 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_185a8._0_8_,'\0');
      }
      pfStack_185e0 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_18570._M_i,
              *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_185e0 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_185b8._8_8_,'\0');
      pfStack_185e0 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_18578.seqtree,
              *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + _Var28._M_i * 8));
      pfStack_185e0 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_185c0,'\0');
      pfStack_185e0 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar27,(__timezone_ptr_t)0x0);
      pfStack_185e0 = (fdb_kvs_handle *)0x1104e9;
      tVar36 = _utime_gap(tVar37,(timeval)auStack_18558);
      if ((ulong)auStack_185a8._8_8_ <= (fdb_kvs_handle *)tVar36.tv_sec) break;
      _Var28._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var28._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var28._M_i == (undefined1 *)0x2710) {
        _Var28._M_i = 0;
      }
    }
    pfStack_185e0 = (fdb_kvs_handle *)0x110517;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_185d0,0x3c);
    ptr_fhandle = (filemgr *)auStack_18450._0_8_;
    pfVar13 = (fdb_kvs_handle *)auStack_18450._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_185e0 = (fdb_kvs_handle *)0x11052e;
    pcVar33 = (char *)auStack_185d0;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_185d0,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_185e0 = (fdb_kvs_handle *)0x110542;
    pcVar33 = (char *)auStack_185b8._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_185b8._8_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_185e0 = (fdb_kvs_handle *)0x11055b;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_185c0,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_1851a = uStack_1851a & 0xff00;
    pcVar33 = auStack_18560;
    pfStack_185e0 = (fdb_kvs_handle *)0x110580;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_185e0 = (fdb_kvs_handle *)0x11059c;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_185c0,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_185e0 = (fdb_kvs_handle *)0x1105af;
    fVar4 = fdb_close((fdb_file_handle *)auStack_18560);
    pcVar33 = (char *)auStack_18560;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_185e0 = (fdb_kvs_handle *)0x1105cb;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_185c0,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_185e0 = (fdb_kvs_handle *)0x1105e7;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_185c0,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_185e0 = (fdb_kvs_handle *)0x1105f9;
    pcVar33 = (char *)auStack_185c0;
    fVar4 = fdb_close((fdb_file_handle *)auStack_185c0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_1851a = CONCAT11(uStack_1851a._1_1_,1);
    pcVar33 = auStack_185c0;
    pfStack_185e0 = (fdb_kvs_handle *)0x11061e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_185e0 = (fdb_kvs_handle *)0x110634;
    pcVar33 = (char *)auStack_185b8._8_8_;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_185b8._8_8_,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_185e0 = (fdb_kvs_handle *)0x110646;
    pcVar33 = (char *)auStack_185b8._8_8_;
    fVar4 = fdb_close((fdb_file_handle *)auStack_185b8._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_1851a = uStack_1851a & 0xff00;
    pcVar33 = auStack_185b8 + 8;
    pfStack_185e0 = (fdb_kvs_handle *)0x11066b;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar22 = "compact_test_non.manual";
    pfStack_185e0 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_185b8._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_185d0);
    pfStack_185e0 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_185a8._0_8_);
    pfStack_185e0 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_185c0);
    uStack_1851a = CONCAT11(uStack_1851a._1_1_,1);
    pfStack_185e0 = (fdb_kvs_handle *)0x1106bf;
    pcVar33 = (char *)ptr_fhandle;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar33 = "compact_test_non.manual";
    pfStack_185e0 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_1851a = uStack_1851a & 0xff00;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110702;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar33 = "compact_test_manual_compacted";
    pfStack_185e0 = (fdb_kvs_handle *)0x11071f;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_1851a = CONCAT11(uStack_1851a._1_1_,1);
    pcVar33 = "compact_test_manual_compacted";
    pfStack_185e0 = (fdb_kvs_handle *)0x110740;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_1851a = uStack_1851a & 0xff00;
    pcVar33 = "compact_test_non.manual";
    pfStack_185e0 = (fdb_kvs_handle *)0x110760;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_185e0 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_185b8._8_8_);
    pfStack_185e0 = (fdb_kvs_handle *)0x110778;
    fVar4 = fdb_shutdown();
    pcVar33 = (char *)auStack_185b8._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar33 = "compact_test_non.manual";
    pfStack_185e0 = (fdb_kvs_handle *)0x110794;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_18524 = 2;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x1107bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x1107de;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110800;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar33 = auStack_185d0;
    pfStack_185e0 = (fdb_kvs_handle *)0x110822;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non.manual",
                     (fdb_config *)auStack_18548);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar16 = 0;
      do {
        pfStack_185e0 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + lVar16 * 8));
        lVar16 = lVar16 + 1;
      } while (lVar16 != 10000);
      pfStack_185e0 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_185e0 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_185e0 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar22,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var28._M_i = doc._M_i;
LAB_001108eb:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_185e0 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_185e0 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_185e0 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_185e0 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_185e0 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_185e0 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_185e0 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_185e0 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_185e0 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_185e0 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_185e0 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_185e0 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_185e0 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_185e0 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_185e0 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_185e0 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_185e0 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_185e0 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_185e0 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_185e0 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_185e0 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_185e0 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_185e0 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_185e0 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_185e0 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_185e0 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_185e0 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_185e0 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_185e0 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_185e0 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_185e0 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_185e0 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_185e0 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_185e0 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_185e0 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_185e0 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18778 = (fdb_kvs_handle *)0x1109ce;
  pfStack_18608 = (filemgr *)pcVar22;
  pfStack_18600 = pfVar27;
  pfStack_185f8 = (fdb_kvs_handle *)_Var28._M_i;
  pfStack_185f0 = ptr_fhandle;
  pfStack_185e8 = pfVar13;
  pfStack_185e0 = pfVar7;
  gettimeofday(&tStack_18728,(__timezone_ptr_t)0x0);
  pfStack_18778 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_18778 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18778 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_186d2 = 1;
  uStack_186c8._0_2_ = 1;
  uStack_186c8._2_2_ = 0;
  uStack_186c8._4_4_ = 0;
  pfStack_18778 = (fdb_kvs_handle *)0x110a0d;
  fVar4 = fdb_open(&pfStack_18768,"compact_test",(fdb_config *)(auStack_18718 + 0x18));
  pfVar29 = (fdb_config *)(auStack_18718 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar29 = (fdb_config *)auStack_18718;
    pfStack_18778 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_18778 = (fdb_kvs_handle *)0x110a34;
    fVar4 = fdb_kvs_open_default(pfStack_18768,&pfStack_18760,(fdb_kvs_config *)pfVar29);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_18778 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_18738,(__timezone_ptr_t)0x0);
    pfStack_18778 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar33 & 0xffffffff);
    tVar36.tv_usec = tStack_18738.tv_usec;
    tVar36.tv_sec = tStack_18738.tv_sec;
    _Var28._M_i = (long)&atStack_18758[1].tv_sec + 1;
    pfVar7 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar7;
      pfStack_18778 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var28._M_i,"%d",pfVar7);
      pfVar27 = pfStack_18760;
      pfStack_18778 = (fdb_kvs_handle *)0x110a89;
      sVar6 = strlen((char *)_Var28._M_i);
      pfStack_18778 = (fdb_kvs_handle *)0x110aa4;
      fVar4 = fdb_set_kv(pfVar27,(void *)_Var28._M_i,sVar6,"value",5);
      pfVar29 = (fdb_config *)tStack_18738.tv_sec;
      pfVar13 = (fdb_kvs_handle *)tStack_18738.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_18778 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_18778 = (fdb_kvs_handle *)0x110ab8;
      fVar4 = fdb_commit(pfStack_18768,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_18778 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_18778 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_18758,(__timezone_ptr_t)0x0);
      pfStack_18778 = (fdb_kvs_handle *)0x110ae1;
      tVar37 = _utime_gap(tVar36,atStack_18758[0]);
    } while (((filemgr *)tVar37.tv_sec < pcVar33) &&
            (pfVar7 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_18778 = (fdb_kvs_handle *)0x110b01;
    fVar4 = fdb_close(pfStack_18768);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_18778 = (fdb_kvs_handle *)0x110b0a;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_18778 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_18778 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar22,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_18778 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_18778 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_18778 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18778 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_187a0 = (filemgr *)pcVar33;
  pfStack_18798 = pfVar27;
  pfStack_18790 = (fdb_kvs_handle *)_Var28._M_i;
  pfStack_18788 = pfVar29;
  pfStack_18780 = pfVar13;
  pfStack_18778 = pfVar7;
  gettimeofday(&tStack_18aa8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18b18._32_8_ = (btree *)0x0;
  auStack_18b18._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_18898.wal_threshold = 0x1000;
  fStack_18898.compaction_mode = '\x01';
  fStack_18898.compaction_threshold = '\n';
  fStack_18898.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14d0c5;
  pfVar7 = (fdb_kvs_handle *)&pfStack_18b38;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar7,"compact_test",&fStack_18898,1,
                              (char **)(auStack_18b18 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18b18 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18b18._16_8_ = afStack_18a98[0].doc_count;
    auStack_18b18._0_8_ = afStack_18a98[0].filename;
    auStack_18b18._8_8_ = afStack_18a98[0].new_filename;
    info_00 = (fdb_file_info *)auStack_18b30;
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18b38,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_18b18);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info_00 = (fdb_file_info *)auStack_18b20;
    kvs_config_01 = (fdb_file_info *)auStack_18b18;
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b38,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar15 = 0;
    do {
      sprintf((char *)afStack_18a98,"key%06d",uVar15);
      sprintf((char *)afStack_18998,"body%06d",uVar15);
      pfVar7 = (fdb_kvs_handle *)auStack_18b30._0_8_;
      sVar6 = strlen((char *)afStack_18a98);
      sVar8 = strlen((char *)afStack_18998);
      kvs_config_01 = afStack_18998;
      info_00 = afStack_18a98;
      fVar4 = fdb_set_kv(pfVar7,afStack_18a98,sVar6,afStack_18998,sVar8);
      handle = auStack_18b20;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar6 = strlen((char *)afStack_18a98);
      sVar8 = strlen((char *)afStack_18998);
      kvs_config_01 = afStack_18998;
      info_00 = afStack_18a98;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18a98,sVar6,afStack_18998,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar7 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar20 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar20;
    } while (uVar20 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_18b18;
    auStack_18b18._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_18b30 + 8);
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b38,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info_00 = afStack_18a98;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_01 = afStack_18998;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar6 = strlen((char *)info_00);
    sVar8 = strlen((char *)kvs_config_01);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18b30._8_8_,info_00,sVar6,kvs_config_01,sVar8);
    pfVar7 = (fdb_kvs_handle *)auStack_18b30._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info_00 = (fdb_file_info *)0x0;
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar15 = 0;
    uVar30 = 0;
    do {
      sprintf((char *)afStack_18a98,"key%06d",uVar30);
      sprintf((char *)afStack_18998,"body%06d",uVar30);
      pfVar7 = (fdb_kvs_handle *)auStack_18b30._0_8_;
      sVar6 = strlen((char *)afStack_18a98);
      sVar8 = strlen((char *)afStack_18998);
      kvs_config_01 = afStack_18998;
      info_00 = afStack_18a98;
      fVar4 = fdb_set_kv(pfVar7,afStack_18a98,sVar6,afStack_18998,sVar8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info_00 = (fdb_file_info *)(auStack_18b18 + 0x28);
      pfVar7 = pfStack_18b38;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b38,info_00);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar15 < uStack_18ac8) {
        uVar15 = uStack_18ac8;
      }
      uVar20 = (int)uVar30 + 1;
      uVar30 = (ulong)uVar20;
    } while (uVar20 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info_00 = (fdb_file_info *)(auStack_18b18 + 0x28);
    pfVar7 = pfStack_18b38;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b38,info_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar15 < uStack_18ac8) {
      uVar15 = uStack_18ac8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar15);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_18b18 + 0x28);
      pfVar7 = pfStack_18b38;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b38,
                                (fdb_file_info *)(auStack_18b18 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar15 <= uStack_18ac8);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18b38);
    pfVar7 = pfStack_18b38;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar7 = pfStack_18b38;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar22,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_01) {
    memcmp(pfVar7,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_01) {
    kvs_config_01 = info_00;
  }
  memcmp(pfVar7,__s2,(size_t)kvs_config_01);
  return;
}

Assistant:

void compact_wo_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction without reopen test");
}